

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstack::Elf::Object::findSymbolByAddress_abi_cxx11_
          (optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Object *this,Addr addr,int type)

{
  bool bVar1;
  SymbolSection *pSVar2;
  Section *pSVar3;
  element_type *this_00;
  Object *local_f0;
  anon_class_48_6_dc1cbea5 findSym;
  string name;
  Addr addr_local;
  shared_ptr<const_pstack::LzmaReader> reader;
  string local_80 [32];
  undefined8 uStack_60;
  Sym sym;
  undefined1 local_40 [4];
  int type_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_2a;
  char local_29;
  bool haveExactZeroSizeMatch;
  
  findSym.type = (int *)(name.field_2._M_local_buf + 8);
  findSym.this = (Object *)((long)&sym.st_size + 4);
  findSym.name = (string *)&local_29;
  local_29 = '\0';
  findSym.haveExactZeroSizeMatch = (bool *)&name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  findSym.addr = &uStack_60;
  findSym.sym = (Sym *)&findSym.haveExactZeroSizeMatch;
  local_f0 = this;
  name.field_2._8_8_ = addr;
  sym.st_size._4_4_ = type;
  pSVar2 = debugSymbols(this);
  bVar1 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                    ((__0 *)&local_f0,pSVar2);
  if (bVar1) {
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
    reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sym._0_8_;
    std::__cxx11::string::string
              (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &findSym.haveExactZeroSizeMatch);
  }
  else {
    pSVar2 = dynamicSymbols(this);
    bVar1 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                      ((__0 *)&local_f0,pSVar2);
    if (bVar1) {
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sym._0_8_;
      std::__cxx11::string::string
                (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &findSym.haveExactZeroSizeMatch);
    }
    else {
      this_00 = (this->debugData).
                super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 == (element_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&addr_local,".gnu_debugdata",(allocator<char> *)local_40);
        pSVar3 = getSection(this,(string *)&addr_local,1);
        std::__cxx11::string::~string((string *)&addr_local);
        if ((pSVar3->shdr).sh_type != 0) {
          Section::io((Section *)local_40);
          std::make_shared<pstack::LzmaReader_const,std::shared_ptr<pstack::Reader_const>>
                    ((shared_ptr<const_pstack::Reader> *)&addr_local);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          local_2a = 1;
          std::
          make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::LzmaReader_const>&,bool>
                    ((Context *)local_40,(shared_ptr<const_pstack::LzmaReader> *)this->context,
                     (bool *)&addr_local);
          std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->debugData).
                      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader);
        }
        this_00 = (this->debugData).
                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (this_00 != (element_type *)0x0) goto LAB_00174291;
      }
      else {
LAB_00174291:
        findSymbolByAddress_abi_cxx11_
                  (__return_storage_ptr__,this_00,name.field_2._8_8_,sym.st_size._4_4_);
        if ((__return_storage_ptr__->
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_engaged != false) goto LAB_001742f2;
        std::
        _Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_reset((_Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)__return_storage_ptr__);
      }
      if (local_29 != '\x01') {
        uStack_60._6_2_ = 0;
        (__return_storage_ptr__->
        super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_engaged = false;
        goto LAB_001742f2;
      }
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sym.st_value;
      reader.super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sym._0_8_;
      std::__cxx11::string::string
                (local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &findSym.haveExactZeroSizeMatch);
    }
  }
  std::
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            (__return_storage_ptr__,
             (pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&addr_local);
  std::__cxx11::string::~string(local_80);
LAB_001742f2:
  std::__cxx11::string::~string((string *)&findSym.haveExactZeroSizeMatch);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<Sym, string>>
Object::findSymbolByAddress(Addr addr, int type)
{
    /* Try to find symbols in these sections */
    bool haveExactZeroSizeMatch = false;

    Sym sym;
    std::string name;
    auto findSym = [&] (auto &table) {
        for (const auto &candidate : table) {
            if (candidate.st_shndx >= sectionHeaders.size())
                continue;
            if (type != STT_NOTYPE && ELF_ST_TYPE(candidate.st_info) != type)
                continue;
            if (candidate.st_value > addr)
                continue;
            if (candidate.st_size + candidate.st_value <= addr) {
                if (candidate.st_size == 0 && candidate.st_value == addr) {
                    sym = candidate;
                    name = table.name(candidate);
                    haveExactZeroSizeMatch = true;
                }
                continue;
            }
            auto &sec = sectionHeaders[candidate.st_shndx];
            if ((sec->shdr.sh_flags & SHF_ALLOC) == 0)
                continue;
            sym = candidate;
            name = table.name(candidate);
            return true;
        }
        sym.st_shndx = SHN_UNDEF;
        return false;
    };
    if (findSym(*debugSymbols()))
        return std::make_pair( sym, name );
    if (findSym(*dynamicSymbols()))
        return std::make_pair( sym, name );
    // .gnu_debugdata is a separate LZMA-compressed ELF image with just
    // a symbol table.
    if (debugData == nullptr) {
#ifdef WITH_LZMA
        auto &gnu_debugdata = getSection(".gnu_debugdata", SHT_PROGBITS );
        if (gnu_debugdata) {
           auto reader = make_shared<const LzmaReader>(gnu_debugdata.io());
           debugData = make_shared<Object>(context, reader, true);
        }
#else
        static bool warned = false;
        if (!warned && context.debug) {
            *context.debug << "warning: no compiled support for LZMA - "
                "can't decode debug data in " << *io << "\n";
            warned = true;
        }
#endif
    }

    if (debugData) {
        auto debugSym = debugData->findSymbolByAddress(addr, type);
        if (debugSym)
            return debugSym;
    }

    if (haveExactZeroSizeMatch)
        return std::make_pair( sym, name );
    sym.st_shndx = SHN_UNDEF;
    return std::nullopt;
}